

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

string * cfd::core::DescriptorNode::GenerateChecksum
                   (string *__return_storage_ptr__,string *descriptor)

{
  undefined1 uVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  undefined1 *puVar5;
  int local_68;
  allocator local_62;
  undefined1 local_61;
  int j_1;
  allocator local_59;
  int j;
  size_type pos;
  char *ch;
  size_t idx;
  int clscount;
  int cls;
  uint64_t c;
  allocator local_19;
  string *local_18;
  string *descriptor_local;
  string *ret;
  
  local_18 = descriptor;
  descriptor_local = __return_storage_ptr__;
  if ((GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GenerateChecksum(std::__cxx11::string_const&)::
                                   kInputCharset_abi_cxx11_), iVar3 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_,
               "0123456789()[],\'/*abcdefgh@:$%{}IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~ijklmnopqrstuvwxyzABCDEFGH`#\"\\ "
               ,&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_);
  }
  if ((GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GenerateChecksum(std::__cxx11::string_const&)::
                                   kChecksumCharset_abi_cxx11_), iVar3 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_
               ,"qpzry9x8gf2tvdw0s3jn54khce6mua7l",(allocator *)((long)&c + 3));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&c + 3));
    __cxa_atexit(::std::__cxx11::string::~string,
                 &GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_)
    ;
  }
  _clscount = 1;
  idx._4_4_ = 0;
  idx._0_4_ = 0;
  ch = (char *)0x0;
  while( true ) {
    pcVar2 = ch;
    pcVar4 = (char *)::std::__cxx11::string::size();
    if (pcVar4 <= pcVar2) {
      if (0 < (int)idx) {
        _clscount = GenerateChecksum::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)
                               &GenerateChecksum(std::__cxx11::string_const&)::poly_mod,_clscount,
                               idx._4_4_);
      }
      for (j_1 = 0; j_1 < 8; j_1 = j_1 + 1) {
        _clscount = GenerateChecksum::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)
                               &GenerateChecksum(std::__cxx11::string_const&)::poly_mod,_clscount,0)
        ;
      }
      _clscount = _clscount ^ 1;
      local_61 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,8,' ',&local_62);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_62);
      for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
        puVar5 = (undefined1 *)::std::__cxx11::string::operator[](0xa25730);
        uVar1 = *puVar5;
        puVar5 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = uVar1;
      }
      return __return_storage_ptr__;
    }
    pos = ::std::__cxx11::string::operator[]((ulong)local_18);
    _j = ::std::__cxx11::string::find('\b',(ulong)(uint)(int)*(char *)pos);
    if (_j == 0xffffffffffffffff) break;
    _clscount = GenerateChecksum::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           &GenerateChecksum(std::__cxx11::string_const&)::poly_mod,_clscount,
                           (uint)_j & 0x1f);
    idx._4_4_ = idx._4_4_ * 3 + (int)(_j >> 5);
    idx._0_4_ = (int)idx + 1;
    if ((int)idx == 3) {
      _clscount = GenerateChecksum::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             &GenerateChecksum(std::__cxx11::string_const&)::poly_mod,_clscount,
                             idx._4_4_);
      idx._4_4_ = 0;
      idx._0_4_ = 0;
    }
    ch = ch + 1;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_59);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorNode::GenerateChecksum(const std::string& descriptor) {
  // base
  // bitcoin/src/script/descriptor.cpp
  // std::string DescriptorChecksum(const Span<const char>& span)

  /** A character set designed such that:
   *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
   *  - Case errors cause an offset that's a multiple of 32.
   *  - As many alphabetic characters are in the same group (while following the above restrictions).
   *
   * If p(x) gives the position of a character c in this character set, every group of 3 characters
   * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
   * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
   * affect a single symbol.
   *
   * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
   * the position within the groups.
   */
  static const std::string kInputCharset =
      "0123456789()[],'/*abcdefgh@:$%{}"
      "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
      "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

  /** The character set for the checksum itself (same as bech32). */
  static const std::string kChecksumCharset =
      "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

  static auto poly_mod = [](uint64_t c, int val) -> uint64_t {
    uint8_t c0 = c >> 35;
    c = ((c & 0x7ffffffff) << 5) ^ val;
    if (c0 & 1) c ^= 0xf5dee51989;
    if (c0 & 2) c ^= 0xa9fdca3312;
    if (c0 & 4) c ^= 0x1bab10e32d;
    if (c0 & 8) c ^= 0x3706b1677a;
    if (c0 & 16) c ^= 0x644d626ffd;
    return c;
  };

  uint64_t c = 1;
  int cls = 0;
  int clscount = 0;
  for (size_t idx = 0; idx < descriptor.size(); ++idx) {
    const char& ch = descriptor[idx];
    auto pos = kInputCharset.find(ch);
    if (pos == std::string::npos) return "";
    // Emit a symbol for the position inside the group, for every character.
    c = poly_mod(c, pos & 31);
    // Accumulate the group numbers
    cls = cls * 3 + static_cast<int>(pos >> 5);
    if (++clscount == 3) {
      // NOLINT Emit an extra symbol representing the group numbers, for every 3 characters.
      c = poly_mod(c, cls);
      cls = 0;
      clscount = 0;
    }
  }
  if (clscount > 0) c = poly_mod(c, cls);
  // Shift further to determine the checksum.
  for (int j = 0; j < 8; ++j) c = poly_mod(c, 0);
  // Prevent appending zeroes from not affecting the checksum.
  c ^= 1;

  std::string ret(8, ' ');
  for (int j = 0; j < 8; ++j)
    ret[j] = kChecksumCharset[(c >> (5 * (7 - j))) & 31];

  return ret;
}